

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O2

void roaring64_bitmap_or_inplace(roaring64_bitmap_t *r1,roaring64_bitmap_t *r2)

{
  container_t *c;
  art_val_t *paVar1;
  art_val_t *paVar2;
  int iVar3;
  container_t *pcVar4;
  leaf_t val;
  ulong uVar5;
  uint8_t typecode2;
  byte local_169;
  roaring64_bitmap_t *local_168;
  undefined8 local_160;
  roaring64_bitmap_t *local_158;
  art_iterator_t it1;
  art_iterator_t it2;
  
  if (r1 != r2) {
    art_init_iterator(&it1,&r1->art,true);
    art_init_iterator(&it2,&r2->art,true);
    local_168 = r1;
    local_158 = r2;
LAB_001139d3:
    while( true ) {
      paVar2 = it2.value;
      if (it1.value == (art_val_t *)0x0 && it2.value == (art_val_t *)0x0) break;
      if (it1.value == (art_val_t *)0x0 || it2.value == (art_val_t *)0x0) {
        if (it1.value == (art_val_t *)0x0) goto LAB_00113afb;
        if (it2.value == (art_val_t *)0x0) goto LAB_00113a38;
      }
      else {
        iVar3 = art_compare_keys(it1.key,it2.key);
        paVar1 = it1.value;
        if (iVar3 == 0) {
          uVar5 = *it2.value;
          c = r1->containers[*it1.value >> 8];
          pcVar4 = r2->containers[uVar5 >> 8];
          local_169 = (byte)*it1.value;
          if (local_169 != 4) {
            get_writable_copy_if_shared(c,&local_169);
            if ((uint8_t)uVar5 == '\x04') {
              uVar5 = (ulong)*(byte *)((long)pcVar4 + 8);
            }
            local_160 = 0;
            (*(code *)(&DAT_00130308 +
                      *(int *)(&DAT_00130308 +
                              (ulong)((((uint)uVar5 & 0xff) + (uint)local_169 * 4) - 5) * 4)))();
            return;
          }
          pcVar4 = container_or(c,'\x04',pcVar4,(uint8_t)uVar5,&typecode2);
          if (pcVar4 != c) {
            container_free(c,'\x04');
            uVar5 = *paVar1;
            local_168->containers[uVar5 >> 8] = pcVar4;
            *paVar1 = CONCAT71((int7)(uVar5 >> 8),typecode2);
          }
          art_iterator_next(&it1);
          art_iterator_next(&it2);
          r1 = local_168;
          r2 = local_158;
        }
        else {
          if (paVar2 != (art_val_t *)0x0 && -1 < iVar3) goto LAB_00113b04;
LAB_00113a38:
          art_iterator_next(&it1);
        }
      }
    }
  }
  return;
LAB_00113afb:
  if (it2.value != (art_val_t *)0x0) {
LAB_00113b04:
    val = copy_leaf_container(r2,r1,*it2.value);
    art_iterator_insert(&it1,it2.key,val);
    art_iterator_next(&it2);
  }
  goto LAB_001139d3;
}

Assistant:

void roaring64_bitmap_or_inplace(roaring64_bitmap_t *r1,
                                 const roaring64_bitmap_t *r2) {
    if (r1 == r2) {
        return;
    }
    art_iterator_t it1 = art_init_iterator(&r1->art, /*first=*/true);
    art_iterator_t it2 = art_init_iterator((art_t *)&r2->art, /*first=*/true);

    while (it1.value != NULL || it2.value != NULL) {
        bool it1_present = it1.value != NULL;
        bool it2_present = it2.value != NULL;

        // Cases:
        // 1. it1_present  && !it2_present -> it1++
        // 2. !it1_present && it2_present  -> add it2, it2++
        // 3. it1_present  && it2_present
        //    a. it1 <  it2 -> it1++
        //    b. it1 == it2 -> it1 | it2, it1++, it2++
        //    c. it1 >  it2 -> add it2, it2++
        int compare_result = 0;
        if (it1_present && it2_present) {
            compare_result = compare_high48(it1.key, it2.key);
            if (compare_result == 0) {
                // Case 3b: iterators at the same high key position.
                leaf_t *leaf1 = (leaf_t *)it1.value;
                leaf_t leaf2 = (leaf_t)*it2.value;
                uint8_t typecode1 = get_typecode(*leaf1);
                container_t *container1 = get_container(r1, *leaf1);
                uint8_t typecode2;
                container_t *container2;
                if (get_typecode(*leaf1) == SHARED_CONTAINER_TYPE) {
                    container2 = container_or(container1, typecode1,
                                              get_container(r2, leaf2),
                                              get_typecode(leaf2), &typecode2);
                } else {
                    container2 = container_ior(container1, typecode1,
                                               get_container(r2, leaf2),
                                               get_typecode(leaf2), &typecode2);
                }
                if (container2 != container1) {
                    container_free(container1, typecode1);
                    replace_container(r1, leaf1, container2, typecode2);
                }
                art_iterator_next(&it1);
                art_iterator_next(&it2);
            }
        }
        if ((it1_present && !it2_present) || compare_result < 0) {
            // Cases 1 and 3a: it1 is the only iterator or is before it2.
            art_iterator_next(&it1);
        } else if ((!it1_present && it2_present) || compare_result > 0) {
            // Cases 2 and 3c: it2 is the only iterator or is before it1.
            leaf_t result_leaf =
                copy_leaf_container(r2, r1, (leaf_t)*it2.value);
            art_iterator_insert(&it1, it2.key, (art_val_t)result_leaf);
            art_iterator_next(&it2);
        }
    }
}